

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServerProtocol.cxx
# Opt level: O2

bool __thiscall
cmServerProtocol1::DoActivate(cmServerProtocol1 *this,cmServerRequest *request,string *errorMessage)

{
  cmake *this_00;
  cmState *state;
  bool bVar1;
  __type _Var2;
  Value *pVVar3;
  char *__s;
  long lVar4;
  string *psVar5;
  Value *this_01;
  __normal_iterator<cmake::GeneratorInfo_*,_std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>_>
  _Var6;
  GeneratorInfo *pGVar7;
  __normal_iterator<cmake::GeneratorInfo_*,_std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>_>
  __it;
  long lVar8;
  pointer __lhs;
  string suffix;
  string cachedValueCML;
  allocator<char> local_2e1;
  GeneratorInfo *local_2e0;
  string valueCML;
  vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_> generators;
  string generator;
  string sourceDirectory;
  string cachedValue;
  string buildDirectory;
  string extraGenerator;
  string platform;
  string toolset;
  string cachePath;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  this_01 = &request->Data;
  pVVar3 = Json::Value::operator[](this_01,&kSOURCE_DIRECTORY_KEY_abi_cxx11_);
  Json::Value::asString_abi_cxx11_(&sourceDirectory,pVVar3);
  pVVar3 = Json::Value::operator[](this_01,&kBUILD_DIRECTORY_KEY_abi_cxx11_);
  Json::Value::asString_abi_cxx11_(&buildDirectory,pVVar3);
  pVVar3 = Json::Value::operator[](this_01,&kGENERATOR_KEY_abi_cxx11_);
  Json::Value::asString_abi_cxx11_(&generator,pVVar3);
  pVVar3 = Json::Value::operator[](this_01,&kEXTRA_GENERATOR_KEY_abi_cxx11_);
  Json::Value::asString_abi_cxx11_(&extraGenerator,pVVar3);
  pVVar3 = Json::Value::operator[](this_01,&kTOOLSET_KEY_abi_cxx11_);
  Json::Value::asString_abi_cxx11_(&toolset,pVVar3);
  pVVar3 = Json::Value::operator[](this_01,&kPLATFORM_KEY_abi_cxx11_);
  Json::Value::asString_abi_cxx11_(&platform,pVVar3);
  if (sourceDirectory._M_string_length != 0) {
    cmsys::SystemTools::CollapseFullPath(&cachedValue,&sourceDirectory);
    std::__cxx11::string::operator=((string *)&sourceDirectory,(string *)&cachedValue);
    std::__cxx11::string::~string((string *)&cachedValue);
    cmsys::SystemTools::ConvertToUnixSlashes(&sourceDirectory);
  }
  if (buildDirectory._M_string_length == 0) {
LAB_0013f0a2:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cachedValueCML,"\"",(allocator<char> *)&valueCML);
    std::operator+(&suffix,&cachedValueCML,&kBUILD_DIRECTORY_KEY_abi_cxx11_);
    std::operator+(&cachedValue,&suffix,"\" is missing.");
    setErrorMessage(errorMessage,&cachedValue);
LAB_0013f0f7:
    std::__cxx11::string::~string((string *)&cachedValue);
    std::__cxx11::string::~string((string *)&suffix);
    psVar5 = &cachedValueCML;
  }
  else {
    cmsys::SystemTools::CollapseFullPath(&cachedValue,&buildDirectory);
    std::__cxx11::string::operator=((string *)&buildDirectory,(string *)&cachedValue);
    std::__cxx11::string::~string((string *)&cachedValue);
    cmsys::SystemTools::ConvertToUnixSlashes(&buildDirectory);
    if (buildDirectory._M_string_length == 0) goto LAB_0013f0a2;
    this_00 = (this->super_cmServerProtocol).m_CMakeInstance._M_t.
              super___uniq_ptr_impl<cmake,_std::default_delete<cmake>_>._M_t.
              super__Tuple_impl<0UL,_cmake_*,_std::default_delete<cmake>_>.
              super__Head_base<0UL,_cmake_*,_false>._M_head_impl;
    bVar1 = cmsys::SystemTools::PathExists(&buildDirectory);
    if (!bVar1) {
LAB_0013f2e7:
      if (sourceDirectory._M_string_length == 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&cachedValueCML,"\"",(allocator<char> *)&valueCML);
        std::operator+(&suffix,&cachedValueCML,&kSOURCE_DIRECTORY_KEY_abi_cxx11_);
        std::operator+(&cachedValue,&suffix,"\" is unset but required.");
        setErrorMessage(errorMessage,&cachedValue);
      }
      else {
        bVar1 = cmsys::SystemTools::FileIsDirectory(&sourceDirectory);
        if (bVar1) {
          if (generator._M_string_length != 0) {
            generators.
            super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            generators.
            super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            generators.
            super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            cmake::GetRegisteredGenerators(this_00,&generators,true);
            local_2e0 = generators.
                        super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            lVar4 = (long)generators.
                          super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)generators.
                          super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start;
            __lhs = generators.
                    super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>.
                    _M_impl.super__Vector_impl_data._M_start;
            for (lVar8 = lVar4 / 0xa8 >> 2; pGVar7 = __lhs, 0 < lVar8; lVar8 = lVar8 + -1) {
              _Var2 = std::operator==(&__lhs->name,&generator);
              if (_Var2) goto LAB_0013f5ec;
              _Var2 = std::operator==(&__lhs[1].name,&generator);
              pGVar7 = __lhs + 1;
              if (_Var2) goto LAB_0013f5ec;
              _Var2 = std::operator==(&__lhs[2].name,&generator);
              pGVar7 = __lhs + 2;
              if (_Var2) goto LAB_0013f5ec;
              _Var2 = std::operator==(&__lhs[3].name,&generator);
              pGVar7 = __lhs + 3;
              if (_Var2) goto LAB_0013f5ec;
              __lhs = __lhs + 4;
              lVar4 = lVar4 + -0x2a0;
            }
            lVar4 = lVar4 / 0xa8;
            if (lVar4 == 1) {
LAB_0013f5d1:
              _Var2 = std::operator==(&__lhs->name,&generator);
              pGVar7 = local_2e0;
              if (_Var2) {
                pGVar7 = __lhs;
              }
            }
            else if (lVar4 == 2) {
LAB_0013f539:
              _Var2 = std::operator==(&pGVar7->name,&generator);
              if (!_Var2) {
                __lhs = pGVar7 + 1;
                goto LAB_0013f5d1;
              }
            }
            else {
              pGVar7 = local_2e0;
              if ((lVar4 == 3) &&
                 (_Var2 = std::operator==(&__lhs->name,&generator), pGVar7 = __lhs, !_Var2)) {
                pGVar7 = __lhs + 1;
                goto LAB_0013f539;
              }
            }
LAB_0013f5ec:
            if (pGVar7 == generators.
                          super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>
                          ._M_impl.super__Vector_impl_data._M_finish) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&cachedValueCML,"Generator \"",(allocator<char> *)&valueCML);
              std::operator+(&suffix,&cachedValueCML,&generator);
              std::operator+(&cachedValue,&suffix,"\" not supported.");
              setErrorMessage(errorMessage,&cachedValue);
              std::__cxx11::string::~string((string *)&cachedValue);
              std::__cxx11::string::~string((string *)&suffix);
              psVar5 = &cachedValueCML;
LAB_0013f8d7:
              std::__cxx11::string::~string((string *)psVar5);
              bVar1 = false;
            }
            else {
              cachedValue._M_string_length = (size_type)&extraGenerator;
              local_2e0 = generators.
                          super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
              lVar4 = (long)generators.
                            super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)generators.
                            super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start;
              __it._M_current =
                   generators.
                   super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>.
                   _M_impl.super__Vector_impl_data._M_start;
              cachedValue._M_dataplus._M_p = (pointer)&generator;
              for (lVar8 = lVar4 / 0xa8 >> 2; _Var6._M_current = __it._M_current, 0 < lVar8;
                  lVar8 = lVar8 + -1) {
                bVar1 = __gnu_cxx::__ops::
                        _Iter_pred<cmServerProtocol1::DoActivate(cmServerRequest_const&,std::__cxx11::string*)::$_1>
                        ::operator()((_Iter_pred<cmServerProtocol1::DoActivate(cmServerRequest_const&,std::__cxx11::string*)::__1>
                                      *)&cachedValue,__it);
                if (bVar1) goto LAB_0013f7a9;
                bVar1 = __gnu_cxx::__ops::
                        _Iter_pred<cmServerProtocol1::DoActivate(cmServerRequest_const&,std::__cxx11::string*)::$_1>
                        ::operator()((_Iter_pred<cmServerProtocol1::DoActivate(cmServerRequest_const&,std::__cxx11::string*)::__1>
                                      *)&cachedValue,__it._M_current + 1);
                _Var6._M_current = __it._M_current + 1;
                if (bVar1) goto LAB_0013f7a9;
                bVar1 = __gnu_cxx::__ops::
                        _Iter_pred<cmServerProtocol1::DoActivate(cmServerRequest_const&,std::__cxx11::string*)::$_1>
                        ::operator()((_Iter_pred<cmServerProtocol1::DoActivate(cmServerRequest_const&,std::__cxx11::string*)::__1>
                                      *)&cachedValue,__it._M_current + 2);
                _Var6._M_current = __it._M_current + 2;
                if (bVar1) goto LAB_0013f7a9;
                bVar1 = __gnu_cxx::__ops::
                        _Iter_pred<cmServerProtocol1::DoActivate(cmServerRequest_const&,std::__cxx11::string*)::$_1>
                        ::operator()((_Iter_pred<cmServerProtocol1::DoActivate(cmServerRequest_const&,std::__cxx11::string*)::__1>
                                      *)&cachedValue,__it._M_current + 3);
                _Var6._M_current = __it._M_current + 3;
                if (bVar1) goto LAB_0013f7a9;
                __it._M_current = __it._M_current + 4;
                lVar4 = lVar4 + -0x2a0;
              }
              lVar4 = lVar4 / 0xa8;
              if (lVar4 == 1) {
LAB_0013f78e:
                bVar1 = __gnu_cxx::__ops::
                        _Iter_pred<cmServerProtocol1::DoActivate(cmServerRequest_const&,std::__cxx11::string*)::$_1>
                        ::operator()((_Iter_pred<cmServerProtocol1::DoActivate(cmServerRequest_const&,std::__cxx11::string*)::__1>
                                      *)&cachedValue,__it);
                _Var6._M_current = local_2e0;
                if (bVar1) {
                  _Var6._M_current = __it._M_current;
                }
              }
              else if (lVar4 == 2) {
LAB_0013f767:
                bVar1 = __gnu_cxx::__ops::
                        _Iter_pred<cmServerProtocol1::DoActivate(cmServerRequest_const&,std::__cxx11::string*)::$_1>
                        ::operator()((_Iter_pred<cmServerProtocol1::DoActivate(cmServerRequest_const&,std::__cxx11::string*)::__1>
                                      *)&cachedValue,_Var6);
                if (!bVar1) {
                  __it._M_current = _Var6._M_current + 1;
                  goto LAB_0013f78e;
                }
              }
              else {
                _Var6._M_current = local_2e0;
                if ((lVar4 == 3) &&
                   (bVar1 = __gnu_cxx::__ops::
                            _Iter_pred<cmServerProtocol1::DoActivate(cmServerRequest_const&,std::__cxx11::string*)::$_1>
                            ::operator()((_Iter_pred<cmServerProtocol1::DoActivate(cmServerRequest_const&,std::__cxx11::string*)::__1>
                                          *)&cachedValue,__it), _Var6._M_current = __it._M_current,
                   !bVar1)) {
                  _Var6._M_current = __it._M_current + 1;
                  goto LAB_0013f767;
                }
              }
LAB_0013f7a9:
              if (_Var6._M_current ==
                  generators.
                  super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>.
                  _M_impl.super__Vector_impl_data._M_finish) {
                std::operator+(&valueCML,"The combination of generator \"",&generator);
                std::operator+(&cachedValueCML,&valueCML,"\" and extra generator \"");
                std::operator+(&suffix,&cachedValueCML,&extraGenerator);
                std::operator+(&cachedValue,&suffix,"\" is not supported.");
                setErrorMessage(errorMessage,&cachedValue);
                std::__cxx11::string::~string((string *)&cachedValue);
                std::__cxx11::string::~string((string *)&suffix);
                std::__cxx11::string::~string((string *)&cachedValueCML);
                psVar5 = &valueCML;
                goto LAB_0013f8d7;
              }
              if (((_Var6._M_current)->supportsToolset == false) && (toolset._M_string_length != 0))
              {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&cachedValue,
                           "Toolset was provided but is not supported by the requested generator.",
                           (allocator<char> *)&suffix);
                setErrorMessage(errorMessage,&cachedValue);
LAB_0013f8cf:
                psVar5 = &cachedValue;
                goto LAB_0013f8d7;
              }
              if (((_Var6._M_current)->supportsPlatform == false) &&
                 (platform._M_string_length != 0)) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&cachedValue,
                           "Platform was provided but is not supported by the requested generator.",
                           (allocator<char> *)&suffix);
                setErrorMessage(errorMessage,&cachedValue);
                goto LAB_0013f8cf;
              }
              std::__cxx11::string::string((string *)&local_d0,(string *)&generator);
              std::__cxx11::string::string((string *)&local_f0,(string *)&extraGenerator);
              std::__cxx11::string::string((string *)&local_70,(string *)&toolset);
              std::__cxx11::string::string((string *)&local_90,(string *)&platform);
              std::__cxx11::string::string((string *)&local_b0,(string *)&sourceDirectory);
              std::__cxx11::string::string((string *)&local_50,(string *)&buildDirectory);
              GeneratorInformation::GeneratorInformation
                        ((GeneratorInformation *)&cachedValue,&local_d0,&local_f0,&local_70,
                         &local_90,&local_b0,&local_50);
              GeneratorInformation::operator=
                        (&this->GeneratorInfo,(GeneratorInformation *)&cachedValue);
              GeneratorInformation::~GeneratorInformation((GeneratorInformation *)&cachedValue);
              std::__cxx11::string::~string((string *)&local_50);
              std::__cxx11::string::~string((string *)&local_b0);
              std::__cxx11::string::~string((string *)&local_90);
              std::__cxx11::string::~string((string *)&local_70);
              std::__cxx11::string::~string((string *)&local_f0);
              std::__cxx11::string::~string((string *)&local_d0);
              this->m_State = STATE_ACTIVE;
              bVar1 = true;
            }
            std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>::~vector
                      (&generators);
            goto LAB_0013f11a;
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&cachedValueCML,"\"",(allocator<char> *)&valueCML);
          std::operator+(&suffix,&cachedValueCML,&kGENERATOR_KEY_abi_cxx11_);
          std::operator+(&cachedValue,&suffix,"\" is unset but required.");
          setErrorMessage(errorMessage,&cachedValue);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&cachedValueCML,"\"",(allocator<char> *)&valueCML);
          std::operator+(&suffix,&cachedValueCML,&kSOURCE_DIRECTORY_KEY_abi_cxx11_);
          std::operator+(&cachedValue,&suffix,"\" is not a directory.");
          setErrorMessage(errorMessage,&cachedValue);
        }
      }
      goto LAB_0013f0f7;
    }
    bVar1 = cmsys::SystemTools::FileIsDirectory(&buildDirectory);
    if (!bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cachedValueCML,"\"",(allocator<char> *)&valueCML);
      std::operator+(&suffix,&cachedValueCML,&kBUILD_DIRECTORY_KEY_abi_cxx11_);
      std::operator+(&cachedValue,&suffix,"\" exists but is not a directory.");
      setErrorMessage(errorMessage,&cachedValue);
      goto LAB_0013f0f7;
    }
    cmake::FindCacheFile(&cachePath,&buildDirectory);
    bVar1 = cmake::LoadCache(this_00,&cachePath);
    if (!bVar1) {
LAB_0013f2da:
      std::__cxx11::string::~string((string *)&cachePath);
      goto LAB_0013f2e7;
    }
    state = this_00->State;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cachedValue,"CMAKE_GENERATOR",(allocator<char> *)&cachedValueCML);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&suffix,"generator",(allocator<char> *)&valueCML);
    bVar1 = getOrTestValue(state,&cachedValue,&generator,&suffix,errorMessage);
    std::__cxx11::string::~string((string *)&suffix);
    std::__cxx11::string::~string((string *)&cachedValue);
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cachedValue,"CMAKE_EXTRA_GENERATOR",(allocator<char> *)&cachedValueCML);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&suffix,"extra generator",(allocator<char> *)&valueCML);
      bVar1 = getOrTestValue(state,&cachedValue,&extraGenerator,&suffix,errorMessage);
      std::__cxx11::string::~string((string *)&suffix);
      std::__cxx11::string::~string((string *)&cachedValue);
      if (bVar1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&suffix,"CMAKE_HOME_DIRECTORY",(allocator<char> *)&cachedValueCML);
        __s = cmState::GetCacheEntryValue(state,&suffix);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&cachedValue,__s,(allocator<char> *)&valueCML);
        std::__cxx11::string::~string((string *)&suffix);
        if (sourceDirectory._M_string_length == 0) {
          std::__cxx11::string::_M_assign((string *)&sourceDirectory);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&suffix,"/CMakeLists.txt",(allocator<char> *)&cachedValueCML);
          std::operator+(&cachedValueCML,&cachedValue,&suffix);
          std::operator+(&valueCML,&sourceDirectory,&suffix);
          bVar1 = cmsys::SystemTools::SameFile(&valueCML,&cachedValueCML);
          if (!bVar1) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&generators,
                       "\"CMAKE_HOME_DIRECTORY\" is set but incompatible with configured source directory value."
                       ,&local_2e1);
            setErrorMessage(errorMessage,(string *)&generators);
            std::__cxx11::string::~string((string *)&generators);
            std::__cxx11::string::~string((string *)&valueCML);
            std::__cxx11::string::~string((string *)&cachedValueCML);
            std::__cxx11::string::~string((string *)&suffix);
            std::__cxx11::string::~string((string *)&cachedValue);
            goto LAB_0013f5b6;
          }
          std::__cxx11::string::~string((string *)&valueCML);
          std::__cxx11::string::~string((string *)&cachedValueCML);
          std::__cxx11::string::~string((string *)&suffix);
        }
        std::__cxx11::string::~string((string *)&cachedValue);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&cachedValue,"CMAKE_GENERATOR_TOOLSET",
                   (allocator<char> *)&cachedValueCML);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&suffix,"toolset",(allocator<char> *)&valueCML);
        bVar1 = getOrTestValue(state,&cachedValue,&toolset,&suffix,errorMessage);
        std::__cxx11::string::~string((string *)&suffix);
        std::__cxx11::string::~string((string *)&cachedValue);
        if (bVar1) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&cachedValue,"CMAKE_GENERATOR_PLATFORM",
                     (allocator<char> *)&cachedValueCML);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&suffix,"platform",(allocator<char> *)&valueCML);
          bVar1 = getOrTestValue(state,&cachedValue,&platform,&suffix,errorMessage);
          std::__cxx11::string::~string((string *)&suffix);
          std::__cxx11::string::~string((string *)&cachedValue);
          if (bVar1) goto LAB_0013f2da;
        }
      }
    }
LAB_0013f5b6:
    psVar5 = &cachePath;
  }
  std::__cxx11::string::~string((string *)psVar5);
  bVar1 = false;
LAB_0013f11a:
  std::__cxx11::string::~string((string *)&platform);
  std::__cxx11::string::~string((string *)&toolset);
  std::__cxx11::string::~string((string *)&extraGenerator);
  std::__cxx11::string::~string((string *)&generator);
  std::__cxx11::string::~string((string *)&buildDirectory);
  std::__cxx11::string::~string((string *)&sourceDirectory);
  return bVar1;
}

Assistant:

bool cmServerProtocol1::DoActivate(const cmServerRequest& request,
                                   std::string* errorMessage)
{
  std::string sourceDirectory = request.Data[kSOURCE_DIRECTORY_KEY].asString();
  std::string buildDirectory = request.Data[kBUILD_DIRECTORY_KEY].asString();
  std::string generator = request.Data[kGENERATOR_KEY].asString();
  std::string extraGenerator = request.Data[kEXTRA_GENERATOR_KEY].asString();
  std::string toolset = request.Data[kTOOLSET_KEY].asString();
  std::string platform = request.Data[kPLATFORM_KEY].asString();

  // normalize source and build directory
  if (!sourceDirectory.empty()) {
    sourceDirectory = cmSystemTools::CollapseFullPath(sourceDirectory);
    cmSystemTools::ConvertToUnixSlashes(sourceDirectory);
  }
  if (!buildDirectory.empty()) {
    buildDirectory = cmSystemTools::CollapseFullPath(buildDirectory);
    cmSystemTools::ConvertToUnixSlashes(buildDirectory);
  }

  if (buildDirectory.empty()) {
    setErrorMessage(errorMessage,
                    std::string("\"") + kBUILD_DIRECTORY_KEY +
                      "\" is missing.");
    return false;
  }

  cmake* cm = CMakeInstance();
  if (cmSystemTools::PathExists(buildDirectory)) {
    if (!cmSystemTools::FileIsDirectory(buildDirectory)) {
      setErrorMessage(errorMessage,
                      std::string("\"") + kBUILD_DIRECTORY_KEY +
                        "\" exists but is not a directory.");
      return false;
    }

    const std::string cachePath = cmake::FindCacheFile(buildDirectory);
    if (cm->LoadCache(cachePath)) {
      cmState* state = cm->GetState();

      // Check generator:
      if (!getOrTestValue(state, "CMAKE_GENERATOR", generator, "generator",
                          errorMessage)) {
        return false;
      }

      // check extra generator:
      if (!getOrTestValue(state, "CMAKE_EXTRA_GENERATOR", extraGenerator,
                          "extra generator", errorMessage)) {
        return false;
      }

      // check sourcedir:
      if (!getOrTestHomeDirectory(state, sourceDirectory, errorMessage)) {
        return false;
      }

      // check toolset:
      if (!getOrTestValue(state, "CMAKE_GENERATOR_TOOLSET", toolset, "toolset",
                          errorMessage)) {
        return false;
      }

      // check platform:
      if (!getOrTestValue(state, "CMAKE_GENERATOR_PLATFORM", platform,
                          "platform", errorMessage)) {
        return false;
      }
    }
  }

  if (sourceDirectory.empty()) {
    setErrorMessage(errorMessage,
                    std::string("\"") + kSOURCE_DIRECTORY_KEY +
                      "\" is unset but required.");
    return false;
  }
  if (!cmSystemTools::FileIsDirectory(sourceDirectory)) {
    setErrorMessage(errorMessage,
                    std::string("\"") + kSOURCE_DIRECTORY_KEY +
                      "\" is not a directory.");
    return false;
  }
  if (generator.empty()) {
    setErrorMessage(errorMessage,
                    std::string("\"") + kGENERATOR_KEY +
                      "\" is unset but required.");
    return false;
  }

  std::vector<cmake::GeneratorInfo> generators;
  cm->GetRegisteredGenerators(generators);
  auto baseIt = std::find_if(generators.begin(), generators.end(),
                             [&generator](const cmake::GeneratorInfo& info) {
                               return info.name == generator;
                             });
  if (baseIt == generators.end()) {
    setErrorMessage(errorMessage,
                    std::string("Generator \"") + generator +
                      "\" not supported.");
    return false;
  }
  auto extraIt = std::find_if(
    generators.begin(), generators.end(),
    [&generator, &extraGenerator](const cmake::GeneratorInfo& info) {
      return info.baseName == generator && info.extraName == extraGenerator;
    });
  if (extraIt == generators.end()) {
    setErrorMessage(errorMessage,
                    std::string("The combination of generator \"" + generator +
                                "\" and extra generator \"" + extraGenerator +
                                "\" is not supported."));
    return false;
  }
  if (!extraIt->supportsToolset && !toolset.empty()) {
    setErrorMessage(errorMessage,
                    std::string("Toolset was provided but is not supported by "
                                "the requested generator."));
    return false;
  }
  if (!extraIt->supportsPlatform && !platform.empty()) {
    setErrorMessage(errorMessage,
                    std::string("Platform was provided but is not supported "
                                "by the requested generator."));
    return false;
  }

  this->GeneratorInfo =
    GeneratorInformation(generator, extraGenerator, toolset, platform,
                         sourceDirectory, buildDirectory);

  this->m_State = STATE_ACTIVE;
  return true;
}